

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  BVH *bvh;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  byte bVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  byte bVar23;
  bool bVar24;
  int iVar25;
  byte bVar26;
  undefined4 uVar27;
  ulong uVar28;
  long lVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar30;
  NodeRef root;
  size_t sVar31;
  size_t sVar32;
  byte bVar33;
  uint uVar34;
  NodeRef *pNVar35;
  byte bVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 ai_3;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  vint4 ai_1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 ai;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 bi;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi_1;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vint4 bi_3;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar78;
  float fVar79;
  vint4 ai_2;
  float fVar80;
  undefined1 auVar77 [16];
  vint4 bi_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vfloat4 a0;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  int iVar39;
  int iVar53;
  int iVar54;
  int iVar55;
  
  bvh = (BVH *)This->ptr;
  sVar32 = (bvh->root).ptr;
  if (sVar32 != 8) {
    auVar45 = *(undefined1 (*) [16])(ray + 0x80);
    auVar42 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar13 = ZEXT812(0) << 0x20;
    auVar43 = ZEXT816(0) << 0x40;
    uVar9 = vcmpps_avx512vl(auVar45,auVar43,5);
    uVar37 = vpcmpeqd_avx512vl(auVar42,(undefined1  [16])valid_i->field_0);
    uVar37 = ((byte)uVar9 & 0xf) & uVar37;
    bVar36 = (byte)uVar37;
    if (bVar36 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      auVar40._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar40._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar40._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar40._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar41 = vfmadd231ps_fma(auVar40,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar41 = vfmadd231ps_fma(auVar41,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar40 = vrsqrt14ps_avx512vl(auVar41);
      auVar44._8_4_ = 0xbf000000;
      auVar44._0_8_ = 0xbf000000bf000000;
      auVar44._12_4_ = 0xbf000000;
      auVar41 = vmulps_avx512vl(auVar41,auVar44);
      fVar76 = auVar40._0_4_;
      fVar78 = auVar40._4_4_;
      fVar79 = auVar40._8_4_;
      fVar80 = auVar40._12_4_;
      auVar49._0_4_ = fVar76 * fVar76 * fVar76 * auVar41._0_4_;
      auVar49._4_4_ = fVar78 * fVar78 * fVar78 * auVar41._4_4_;
      auVar49._8_4_ = fVar79 * fVar79 * fVar79 * auVar41._8_4_;
      auVar49._12_4_ = fVar80 * fVar80 * fVar80 * auVar41._12_4_;
      auVar41._8_4_ = 0x3fc00000;
      auVar41._0_8_ = 0x3fc000003fc00000;
      auVar41._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar49,auVar40,auVar41);
      auVar50._8_4_ = 0x80000000;
      auVar50._0_8_ = 0x8000000080000000;
      auVar50._12_4_ = 0x80000000;
      uVar28 = uVar37;
      do {
        lVar29 = 0;
        for (uVar38 = uVar28; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        uVar38 = (ulong)(uint)((int)lVar29 * 4);
        auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar38 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar38 + 0x50)),0x1c);
        fVar76 = *(float *)((long)pre.ray_space + (uVar38 - 0x10));
        auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + uVar38 + 0x60)),0x28);
        auVar52._0_4_ = auVar41._0_4_ * fVar76;
        auVar52._4_4_ = auVar41._4_4_ * fVar76;
        auVar52._8_4_ = auVar41._8_4_ * fVar76;
        auVar52._12_4_ = auVar41._12_4_ * fVar76;
        auVar44 = vshufpd_avx(auVar52,auVar52,1);
        auVar41 = vmovshdup_avx(auVar52);
        auVar90._0_4_ = auVar41._0_4_ ^ 0x80000000;
        auVar49 = vunpckhps_avx(auVar52,auVar43);
        auVar87._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
        auVar87._8_8_ = auVar44._8_8_ ^ auVar50._8_8_;
        auVar40 = vinsertps_avx(auVar87,auVar52,0x2a);
        auVar41 = vdpps_avx(auVar40,auVar40,0x7f);
        auVar90._4_12_ = auVar13;
        auVar49 = vshufps_avx(auVar49,auVar90,0x41);
        auVar44 = vdpps_avx(auVar49,auVar49,0x7f);
        uVar9 = vcmpps_avx512vl(auVar41,auVar44,1);
        auVar41 = vpmovm2d_avx512vl(uVar9);
        auVar93._0_4_ = auVar41._0_4_;
        auVar93._4_4_ = auVar93._0_4_;
        auVar93._8_4_ = auVar93._0_4_;
        auVar93._12_4_ = auVar93._0_4_;
        uVar38 = vpmovd2m_avx512vl(auVar93);
        auVar51._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar42._4_4_;
        auVar51._0_4_ = (uint)((byte)uVar38 & 1) * auVar42._0_4_;
        auVar51._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar42._8_4_;
        auVar51._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar42._12_4_;
        auVar41 = vblendvps_avx(auVar40,auVar49,auVar51);
        auVar44 = vdpps_avx(auVar41,auVar41,0x7f);
        auVar94._4_12_ = auVar13;
        auVar94._0_4_ = auVar44._0_4_;
        auVar40 = vrsqrt14ss_avx512f(auVar43,auVar94);
        fVar78 = auVar40._0_4_;
        fVar78 = fVar78 * 1.5 - auVar44._0_4_ * 0.5 * fVar78 * fVar78 * fVar78;
        auVar88._0_4_ = auVar41._0_4_ * fVar78;
        auVar88._4_4_ = auVar41._4_4_ * fVar78;
        auVar88._8_4_ = auVar41._8_4_ * fVar78;
        auVar88._12_4_ = auVar41._12_4_ * fVar78;
        auVar41 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar44 = vshufps_avx(auVar52,auVar52,0xc9);
        auVar95._0_4_ = auVar88._0_4_ * auVar44._0_4_;
        auVar95._4_4_ = auVar88._4_4_ * auVar44._4_4_;
        auVar95._8_4_ = auVar88._8_4_ * auVar44._8_4_;
        auVar95._12_4_ = auVar88._12_4_ * auVar44._12_4_;
        auVar41 = vfmsub231ps_fma(auVar95,auVar52,auVar41);
        auVar44 = vshufps_avx(auVar41,auVar41,0xc9);
        auVar41 = vdpps_avx(auVar44,auVar44,0x7f);
        uVar28 = uVar28 - 1 & uVar28;
        auVar97._4_12_ = auVar13;
        auVar97._0_4_ = auVar41._0_4_;
        auVar40 = vrsqrt14ss_avx512f(auVar43,auVar97);
        fVar78 = auVar40._0_4_;
        fVar78 = fVar78 * 1.5 - auVar41._0_4_ * 0.5 * fVar78 * fVar78 * fVar78;
        auVar91._0_4_ = fVar78 * auVar44._0_4_;
        auVar91._4_4_ = fVar78 * auVar44._4_4_;
        auVar91._8_4_ = fVar78 * auVar44._8_4_;
        auVar91._12_4_ = fVar78 * auVar44._12_4_;
        auVar83._0_4_ = fVar76 * auVar52._0_4_;
        auVar83._4_4_ = fVar76 * auVar52._4_4_;
        auVar83._8_4_ = fVar76 * auVar52._8_4_;
        auVar83._12_4_ = fVar76 * auVar52._12_4_;
        auVar40 = vunpcklps_avx(auVar88,auVar83);
        auVar41 = vunpckhps_avx(auVar88,auVar83);
        auVar49 = vunpcklps_avx(auVar91,auVar43);
        auVar44 = vunpckhps_avx(auVar91,auVar43);
        aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar41,auVar44);
        aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar40,auVar49);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar40,auVar49);
        pre.ray_space[lVar29].vx.field_0 = aVar8;
        pre.ray_space[lVar29].vy.field_0 = aVar6;
        pre.ray_space[lVar29].vz.field_0 = aVar7;
      } while (uVar28 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar98 = ZEXT1664(auVar42);
      auVar43 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar42);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar99 = ZEXT1664(auVar41);
      uVar28 = vcmpps_avx512vl(auVar43,auVar41,1);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar100 = ZEXT1664(auVar43);
      auVar44 = vdivps_avx512vl(auVar43,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar40 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar42);
      uVar38 = vcmpps_avx512vl(auVar40,auVar41,1);
      auVar40 = vdivps_avx512vl(auVar43,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar42 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar42);
      uVar10 = vcmpps_avx512vl(auVar42,auVar41,1);
      auVar42 = vdivps_avx512vl(auVar43,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar24 = (bool)((byte)uVar28 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar44._0_4_;
      bVar24 = (bool)((byte)(uVar28 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar44._4_4_;
      bVar24 = (bool)((byte)(uVar28 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar44._8_4_;
      bVar24 = (bool)((byte)(uVar28 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar44._12_4_;
      bVar24 = (bool)((byte)uVar38 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar40._0_4_;
      bVar24 = (bool)((byte)(uVar38 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar40._4_4_;
      bVar24 = (bool)((byte)(uVar38 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar40._8_4_;
      bVar24 = (bool)((byte)(uVar38 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar40._12_4_;
      bVar24 = (bool)((byte)uVar10 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar42._0_4_;
      bVar24 = (bool)((byte)(uVar10 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar42._4_4_;
      bVar24 = (bool)((byte)(uVar10 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar42._8_4_;
      bVar24 = (bool)((byte)(uVar10 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar24 * 0x5d5e0b6b | (uint)!bVar24 * auVar42._12_4_;
      auVar43 = ZEXT816(0);
      uVar28 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar43,1);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar42._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar28 & 1) * auVar42._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar42._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar42._12_4_;
      uVar28 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar43,5);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar24 = (bool)((byte)uVar28 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar24 * auVar42._0_4_ | (uint)!bVar24 * 0x30;
      bVar24 = (bool)((byte)(uVar28 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar24 * auVar42._4_4_ | (uint)!bVar24 * 0x30;
      bVar24 = (bool)((byte)(uVar28 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar24 * auVar42._8_4_ | (uint)!bVar24 * 0x30;
      bVar24 = (bool)((byte)(uVar28 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar24 * auVar42._12_4_ | (uint)!bVar24 * 0x30;
      uVar28 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar43,5);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar24 = (bool)((byte)uVar28 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar24 * auVar42._0_4_ | (uint)!bVar24 * 0x50;
      bVar24 = (bool)((byte)(uVar28 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar24 * auVar42._4_4_ | (uint)!bVar24 * 0x50;
      bVar24 = (bool)((byte)(uVar28 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar24 * auVar42._8_4_ | (uint)!bVar24 * 0x50;
      bVar24 = (bool)((byte)(uVar28 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar24 * auVar42._12_4_ | (uint)!bVar24 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar101 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar42 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar43);
      tray.tnear.field_0.i[0] =
           (uint)(bVar36 & 1) * auVar42._0_4_ |
           (uint)!(bool)(bVar36 & 1) * stack_near[0].field_0._0_4_;
      bVar24 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tnear.field_0.i[1] =
           (uint)bVar24 * auVar42._4_4_ | (uint)!bVar24 * stack_near[0].field_0._4_4_;
      bVar24 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tnear.field_0.i[2] =
           (uint)bVar24 * auVar42._8_4_ | (uint)!bVar24 * stack_near[0].field_0._8_4_;
      bVar24 = SUB81(uVar37 >> 3,0);
      tray.tnear.field_0.i[3] =
           (uint)bVar24 * auVar42._12_4_ | (uint)!bVar24 * stack_near[0].field_0._12_4_;
      auVar45 = vmaxps_avx512vl(auVar45,auVar43);
      tray.tfar.field_0.i[0] =
           (uint)(bVar36 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar36 & 1) * -0x800000;
      bVar24 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar24 * auVar45._4_4_ | (uint)!bVar24 * -0x800000;
      bVar24 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar24 * auVar45._8_4_ | (uint)!bVar24 * -0x800000;
      bVar24 = SUB81(uVar37 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar24 * auVar45._12_4_ | (uint)!bVar24 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 3;
      }
      else {
        uVar34 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      bVar33 = (byte)((ushort)((short)uVar37 << 0xc) >> 0xc) ^ 0xf;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar30 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar32;
      stack_near[1].field_0.i[0] = tray.tnear.field_0.v[0];
      stack_near[1].field_0.i[1] = tray.tnear.field_0.v[1];
      stack_near[1].field_0.i[2] = tray.tnear.field_0.v[2];
      stack_near[1].field_0.i[3] = tray.tnear.field_0.v[3];
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar102 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar103 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar104 = ZEXT1664(auVar45);
LAB_006ac3f1:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006ac9ef;
          pNVar35 = pNVar35 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar30[-1].v;
          auVar63 = ZEXT1664((undefined1  [16])vVar1.field_0);
          paVar30 = paVar30 + -1;
          uVar37 = vcmpps_avx512vl((undefined1  [16])vVar1.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar37 == '\0');
        uVar27 = (undefined4)uVar37;
        if (uVar34 < (uint)POPCOUNT(uVar27)) {
LAB_006ac42d:
          do {
            iVar25 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006ac9ef;
              uVar9 = vcmpps_avx512vl(auVar63._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar9 != '\0') {
                if ((bVar33 & 0xf) == 0xf) {
                  bVar23 = 0;
                }
                else {
                  uVar37 = (ulong)(bVar33 & 0xf ^ 0xf);
                  bVar26 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                  pvVar2 = This->leafIntersector;
                  bVar23 = 0;
                  do {
                    lVar29 = 0;
                    for (uVar28 = uVar37; (uVar28 & 1) == 0;
                        uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                      lVar29 = lVar29 + 1;
                    }
                    cVar22 = (**(code **)((long)pvVar2 + (ulong)bVar26 * 0x40 + 0x18))
                                       (&pre,ray,lVar29,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    bVar12 = (byte)(1 << ((uint)lVar29 & 0x1f));
                    if (cVar22 == '\0') {
                      bVar12 = 0;
                    }
                    bVar23 = bVar23 | bVar12;
                    uVar37 = uVar37 - 1 & uVar37;
                  } while (uVar37 != 0);
                }
                bVar33 = bVar33 | bVar23;
                if (bVar33 == 0xf) {
                  bVar33 = 0xf;
                  goto LAB_006ac9ef;
                }
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar24 = (bool)(bVar33 >> 1 & 1);
                bVar3 = (bool)(bVar33 >> 2 & 1);
                bVar4 = (bool)(bVar33 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar24 * auVar45._4_4_ | (uint)!bVar24 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar33 & 1) * auVar45._0_4_ |
                     (uint)!(bool)(bVar33 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar3 * auVar45._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar4 * auVar45._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar98 = ZEXT1664(auVar45);
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar99 = ZEXT1664(auVar45);
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar100 = ZEXT1664(auVar45);
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar101 = ZEXT1664(auVar45);
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar102 = ZEXT1664(auVar45);
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar103 = ZEXT1664(auVar45);
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar104 = ZEXT1664(auVar45);
              }
              goto LAB_006ac3f1;
            }
            uVar37 = root.ptr & 0xfffffffffffffff0;
            lVar29 = 0x1c;
            sVar32 = 8;
            auVar45 = auVar101._0_16_;
            do {
              sVar31 = *(size_t *)((uVar37 - 0xe0) + lVar29 * 8);
              if (sVar31 == 8) {
                auVar63 = ZEXT1664(auVar45);
                sVar31 = sVar32;
                break;
              }
              if ((root.ptr & 7) == 0) {
                uVar27 = *(undefined4 *)((root.ptr - 0x50) + lVar29 * 4);
                auVar56._4_4_ = uVar27;
                auVar56._0_4_ = uVar27;
                auVar56._8_4_ = uVar27;
                auVar56._12_4_ = uVar27;
                auVar14._8_8_ = tray.org.field_0._8_8_;
                auVar14._0_8_ = tray.org.field_0._0_8_;
                auVar16._8_8_ = tray.org.field_0._24_8_;
                auVar16._0_8_ = tray.org.field_0._16_8_;
                auVar18._8_8_ = tray.org.field_0._40_8_;
                auVar18._0_8_ = tray.org.field_0._32_8_;
                auVar42 = vsubps_avx(auVar56,auVar14);
                auVar73._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar42._0_4_;
                auVar73._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar42._4_4_;
                auVar73._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar42._8_4_;
                auVar73._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar42._12_4_;
                uVar27 = *(undefined4 *)((root.ptr - 0x30) + lVar29 * 4);
                auVar57._4_4_ = uVar27;
                auVar57._0_4_ = uVar27;
                auVar57._8_4_ = uVar27;
                auVar57._12_4_ = uVar27;
                auVar42 = vsubps_avx(auVar57,auVar16);
                auVar81._0_4_ = tray.rdir.field_0._16_4_ * auVar42._0_4_;
                auVar81._4_4_ = tray.rdir.field_0._20_4_ * auVar42._4_4_;
                auVar81._8_4_ = tray.rdir.field_0._24_4_ * auVar42._8_4_;
                auVar81._12_4_ = tray.rdir.field_0._28_4_ * auVar42._12_4_;
                uVar27 = *(undefined4 *)((root.ptr - 0x10) + lVar29 * 4);
                auVar58._4_4_ = uVar27;
                auVar58._0_4_ = uVar27;
                auVar58._8_4_ = uVar27;
                auVar58._12_4_ = uVar27;
                auVar42 = vsubps_avx(auVar58,auVar18);
                auVar85._0_4_ = tray.rdir.field_0._32_4_ * auVar42._0_4_;
                auVar85._4_4_ = tray.rdir.field_0._36_4_ * auVar42._4_4_;
                auVar85._8_4_ = tray.rdir.field_0._40_4_ * auVar42._8_4_;
                auVar85._12_4_ = tray.rdir.field_0._44_4_ * auVar42._12_4_;
                uVar27 = *(undefined4 *)((root.ptr - 0x40) + lVar29 * 4);
                auVar59._4_4_ = uVar27;
                auVar59._0_4_ = uVar27;
                auVar59._8_4_ = uVar27;
                auVar59._12_4_ = uVar27;
                auVar42 = vsubps_avx(auVar59,auVar14);
                uVar27 = *(undefined4 *)((root.ptr - 0x20) + lVar29 * 4);
                auVar64._4_4_ = uVar27;
                auVar64._0_4_ = uVar27;
                auVar64._8_4_ = uVar27;
                auVar64._12_4_ = uVar27;
                auVar71._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar42._0_4_;
                auVar71._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar42._4_4_;
                auVar71._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar42._8_4_;
                auVar71._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar42._12_4_;
                auVar42 = vsubps_avx(auVar64,auVar16);
                auVar65._0_4_ = tray.rdir.field_0._16_4_ * auVar42._0_4_;
                auVar65._4_4_ = tray.rdir.field_0._20_4_ * auVar42._4_4_;
                auVar65._8_4_ = tray.rdir.field_0._24_4_ * auVar42._8_4_;
                auVar65._12_4_ = tray.rdir.field_0._28_4_ * auVar42._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + lVar29 * 4);
                auVar60._4_4_ = uVar27;
                auVar60._0_4_ = uVar27;
                auVar60._8_4_ = uVar27;
                auVar60._12_4_ = uVar27;
                auVar42 = vsubps_avx(auVar60,auVar18);
                auVar67._0_4_ = tray.rdir.field_0._32_4_ * auVar42._0_4_;
                auVar67._4_4_ = tray.rdir.field_0._36_4_ * auVar42._4_4_;
                auVar67._8_4_ = tray.rdir.field_0._40_4_ * auVar42._8_4_;
                auVar67._12_4_ = tray.rdir.field_0._44_4_ * auVar42._12_4_;
                auVar42 = vminps_avx(auVar73,auVar71);
                auVar43 = vminps_avx(auVar81,auVar65);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar43 = vminps_avx(auVar85,auVar67);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar41 = vmulps_avx512vl(auVar42,auVar102._0_16_);
                auVar42 = vmaxps_avx(auVar73,auVar71);
                auVar43 = vmaxps_avx(auVar81,auVar65);
                auVar43 = vminps_avx(auVar42,auVar43);
                auVar42 = vmaxps_avx(auVar85,auVar67);
                auVar42 = vminps_avx(auVar43,auVar42);
                auVar43 = vmulps_avx512vl(auVar42,auVar103._0_16_);
                auVar20._4_4_ = tray.tnear.field_0.i[1];
                auVar20._0_4_ = tray.tnear.field_0.i[0];
                auVar20._8_4_ = tray.tnear.field_0.i[2];
                auVar20._12_4_ = tray.tnear.field_0.i[3];
                auVar42 = vmaxps_avx(auVar41,auVar20);
                auVar43 = vminps_avx(auVar43,(undefined1  [16])tray.tfar.field_0);
              }
              else {
                uVar27 = *(undefined4 *)((uVar37 - 0x50) + lVar29 * 4);
                auVar68._4_4_ = uVar27;
                auVar68._0_4_ = uVar27;
                auVar68._8_4_ = uVar27;
                auVar68._12_4_ = uVar27;
                uVar27 = *(undefined4 *)((uVar37 - 0x40) + lVar29 * 4);
                auVar66._4_4_ = uVar27;
                auVar66._0_4_ = uVar27;
                auVar66._8_4_ = uVar27;
                auVar66._12_4_ = uVar27;
                uVar27 = *(undefined4 *)((uVar37 - 0x30) + lVar29 * 4);
                auVar61._4_4_ = uVar27;
                auVar61._0_4_ = uVar27;
                auVar61._8_4_ = uVar27;
                auVar61._12_4_ = uVar27;
                uVar27 = *(undefined4 *)((uVar37 - 0x20) + lVar29 * 4);
                auVar96._4_4_ = uVar27;
                auVar96._0_4_ = uVar27;
                auVar96._8_4_ = uVar27;
                auVar96._12_4_ = uVar27;
                uVar27 = *(undefined4 *)((uVar37 - 0x10) + lVar29 * 4);
                auVar92._4_4_ = uVar27;
                auVar92._0_4_ = uVar27;
                auVar92._8_4_ = uVar27;
                auVar92._12_4_ = uVar27;
                uVar27 = *(undefined4 *)(uVar37 + lVar29 * 4);
                auVar82._4_4_ = uVar27;
                auVar82._0_4_ = uVar27;
                auVar82._8_4_ = uVar27;
                auVar82._12_4_ = uVar27;
                fVar76 = *(float *)(uVar37 + 0x10 + lVar29 * 4);
                auVar77._4_4_ = fVar76;
                auVar77._0_4_ = fVar76;
                auVar77._8_4_ = fVar76;
                auVar77._12_4_ = fVar76;
                fVar78 = *(float *)(uVar37 + 0x20 + lVar29 * 4);
                auVar74._4_4_ = fVar78;
                auVar74._0_4_ = fVar78;
                auVar74._8_4_ = fVar78;
                auVar74._12_4_ = fVar78;
                fVar79 = *(float *)(uVar37 + 0x30 + lVar29 * 4);
                auVar69._4_4_ = fVar79;
                auVar69._0_4_ = fVar79;
                auVar69._8_4_ = fVar79;
                auVar69._12_4_ = fVar79;
                auVar15._8_8_ = tray.org.field_0._8_8_;
                auVar15._0_8_ = tray.org.field_0._0_8_;
                auVar17._8_8_ = tray.org.field_0._24_8_;
                auVar17._0_8_ = tray.org.field_0._16_8_;
                auVar19._8_8_ = tray.org.field_0._40_8_;
                auVar19._0_8_ = tray.org.field_0._32_8_;
                auVar84._0_4_ = (float)tray.dir.field_0._32_4_ * fVar76;
                auVar84._4_4_ = (float)tray.dir.field_0._36_4_ * fVar76;
                auVar84._8_4_ = (float)tray.dir.field_0._40_4_ * fVar76;
                auVar84._12_4_ = (float)tray.dir.field_0._44_4_ * fVar76;
                auVar86._0_4_ = (float)tray.dir.field_0._32_4_ * fVar78;
                auVar86._4_4_ = (float)tray.dir.field_0._36_4_ * fVar78;
                auVar86._8_4_ = (float)tray.dir.field_0._40_4_ * fVar78;
                auVar86._12_4_ = (float)tray.dir.field_0._44_4_ * fVar78;
                auVar89._0_4_ = (float)tray.dir.field_0._32_4_ * fVar79;
                auVar89._4_4_ = (float)tray.dir.field_0._36_4_ * fVar79;
                auVar89._8_4_ = (float)tray.dir.field_0._40_4_ * fVar79;
                auVar89._12_4_ = (float)tray.dir.field_0._44_4_ * fVar79;
                auVar42 = vfmadd231ps_avx512vl
                                    (auVar84,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar96);
                auVar43 = vfmadd231ps_avx512vl
                                    (auVar86,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar92);
                auVar41 = vfmadd231ps_avx512vl
                                    (auVar89,auVar82,
                                     (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar42 = vfmadd231ps_avx512vl
                                    (auVar42,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar68);
                auVar43 = vfmadd231ps_avx512vl
                                    (auVar43,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar66);
                auVar41 = vfmadd231ps_avx512vl
                                    (auVar41,auVar61,
                                     (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar40 = auVar98._0_16_;
                auVar44 = vandps_avx512vl(auVar42,auVar40);
                auVar49 = auVar99._0_16_;
                uVar28 = vcmpps_avx512vl(auVar44,auVar49,1);
                bVar24 = (bool)((byte)uVar28 & 1);
                iVar39 = auVar99._0_4_;
                auVar46._0_4_ = (uint)bVar24 * iVar39 | (uint)!bVar24 * auVar42._0_4_;
                bVar24 = (bool)((byte)(uVar28 >> 1) & 1);
                iVar53 = auVar99._4_4_;
                auVar46._4_4_ = (uint)bVar24 * iVar53 | (uint)!bVar24 * auVar42._4_4_;
                bVar24 = (bool)((byte)(uVar28 >> 2) & 1);
                iVar54 = auVar99._8_4_;
                iVar55 = auVar99._12_4_;
                auVar46._8_4_ = (uint)bVar24 * iVar54 | (uint)!bVar24 * auVar42._8_4_;
                bVar24 = (bool)((byte)(uVar28 >> 3) & 1);
                auVar46._12_4_ = (uint)bVar24 * iVar55 | (uint)!bVar24 * auVar42._12_4_;
                auVar42 = vandps_avx512vl(auVar43,auVar40);
                uVar28 = vcmpps_avx512vl(auVar42,auVar49,1);
                bVar24 = (bool)((byte)uVar28 & 1);
                auVar47._0_4_ = (uint)bVar24 * iVar39 | (uint)!bVar24 * auVar43._0_4_;
                bVar24 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar24 * iVar53 | (uint)!bVar24 * auVar43._4_4_;
                bVar24 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar24 * iVar54 | (uint)!bVar24 * auVar43._8_4_;
                bVar24 = (bool)((byte)(uVar28 >> 3) & 1);
                auVar47._12_4_ = (uint)bVar24 * iVar55 | (uint)!bVar24 * auVar43._12_4_;
                auVar42 = vandps_avx512vl(auVar41,auVar40);
                uVar28 = vcmpps_avx512vl(auVar42,auVar49,1);
                bVar24 = (bool)((byte)uVar28 & 1);
                auVar48._0_4_ = (uint)bVar24 * iVar39 | (uint)!bVar24 * auVar41._0_4_;
                bVar24 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar24 * iVar53 | (uint)!bVar24 * auVar41._4_4_;
                bVar24 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar24 * iVar54 | (uint)!bVar24 * auVar41._8_4_;
                bVar24 = (bool)((byte)(uVar28 >> 3) & 1);
                auVar48._12_4_ = (uint)bVar24 * iVar55 | (uint)!bVar24 * auVar41._12_4_;
                auVar42 = vrcp14ps_avx512vl(auVar46);
                auVar41 = auVar100._0_16_;
                auVar43 = vfnmadd213ps_avx512vl(auVar46,auVar42,auVar41);
                auVar44 = vfmadd132ps_avx512vl(auVar43,auVar42,auVar42);
                auVar42 = vrcp14ps_avx512vl(auVar47);
                auVar43 = vfnmadd213ps_avx512vl(auVar47,auVar42,auVar41);
                auVar40 = vfmadd132ps_avx512vl(auVar43,auVar42,auVar42);
                auVar42 = vrcp14ps_avx512vl(auVar48);
                auVar43 = vfnmadd213ps_avx512vl(auVar48,auVar42,auVar41);
                auVar49 = vfmadd132ps_avx512vl(auVar43,auVar42,auVar42);
                auVar52 = auVar104._0_16_;
                auVar50 = vxorps_avx512vl(auVar44,auVar52);
                auVar51 = vxorps_avx512vl(auVar40,auVar52);
                uVar27 = *(undefined4 *)(uVar37 + 0x40 + lVar29 * 4);
                auVar42._4_4_ = uVar27;
                auVar42._0_4_ = uVar27;
                auVar42._8_4_ = uVar27;
                auVar42._12_4_ = uVar27;
                auVar42 = vfmadd213ps_avx512vl(auVar77,auVar19,auVar42);
                uVar27 = *(undefined4 *)(uVar37 + 0x50 + lVar29 * 4);
                auVar43._4_4_ = uVar27;
                auVar43._0_4_ = uVar27;
                auVar43._8_4_ = uVar27;
                auVar43._12_4_ = uVar27;
                auVar43 = vfmadd213ps_avx512vl(auVar74,auVar19,auVar43);
                uVar27 = *(undefined4 *)(uVar37 + 0x60 + lVar29 * 4);
                auVar11._4_4_ = uVar27;
                auVar11._0_4_ = uVar27;
                auVar11._8_4_ = uVar27;
                auVar11._12_4_ = uVar27;
                auVar41 = vfmadd213ps_avx512vl(auVar69,auVar19,auVar11);
                auVar52 = vxorps_avx512vl(auVar49,auVar52);
                auVar42 = vfmadd231ps_fma(auVar42,auVar17,auVar96);
                auVar43 = vfmadd231ps_fma(auVar43,auVar17,auVar92);
                auVar41 = vfmadd231ps_fma(auVar41,auVar17,auVar82);
                auVar42 = vfmadd231ps_fma(auVar42,auVar15,auVar68);
                auVar50 = vmulps_avx512vl(auVar42,auVar50);
                auVar42 = vfmadd231ps_fma(auVar43,auVar15,auVar66);
                auVar51 = vmulps_avx512vl(auVar42,auVar51);
                auVar42 = vfmadd231ps_fma(auVar41,auVar15,auVar61);
                auVar62._0_4_ = auVar52._0_4_ * auVar42._0_4_;
                auVar62._4_4_ = auVar52._4_4_ * auVar42._4_4_;
                auVar62._8_4_ = auVar52._8_4_ * auVar42._8_4_;
                auVar62._12_4_ = auVar52._12_4_ * auVar42._12_4_;
                auVar70._0_4_ = auVar44._0_4_ + auVar50._0_4_;
                auVar70._4_4_ = auVar44._4_4_ + auVar50._4_4_;
                auVar70._8_4_ = auVar44._8_4_ + auVar50._8_4_;
                auVar70._12_4_ = auVar44._12_4_ + auVar50._12_4_;
                auVar72._0_4_ = auVar40._0_4_ + auVar51._0_4_;
                auVar72._4_4_ = auVar40._4_4_ + auVar51._4_4_;
                auVar72._8_4_ = auVar40._8_4_ + auVar51._8_4_;
                auVar72._12_4_ = auVar40._12_4_ + auVar51._12_4_;
                auVar75._0_4_ = auVar49._0_4_ + auVar62._0_4_;
                auVar75._4_4_ = auVar49._4_4_ + auVar62._4_4_;
                auVar75._8_4_ = auVar49._8_4_ + auVar62._8_4_;
                auVar75._12_4_ = auVar49._12_4_ + auVar62._12_4_;
                auVar42 = vpminsd_avx(auVar50,auVar70);
                auVar43 = vpminsd_avx(auVar51,auVar72);
                auVar42 = vpmaxsd_avx(auVar42,auVar43);
                auVar43 = vpminsd_avx(auVar62,auVar75);
                auVar42 = vpmaxsd_avx(auVar42,auVar43);
                auVar43 = vpmaxsd_avx(auVar50,auVar70);
                auVar41 = vpmaxsd_avx(auVar51,auVar72);
                auVar41 = vpminsd_avx(auVar43,auVar41);
                auVar43 = vpmaxsd_avx(auVar62,auVar75);
                auVar43 = vpminsd_avx(auVar41,auVar43);
                auVar41 = vmulps_avx512vl(auVar42,auVar102._0_16_);
                auVar43 = vmulps_avx512vl(auVar43,auVar103._0_16_);
                auVar21._4_4_ = tray.tnear.field_0.i[1];
                auVar21._0_4_ = tray.tnear.field_0.i[0];
                auVar21._8_4_ = tray.tnear.field_0.i[2];
                auVar21._12_4_ = tray.tnear.field_0.i[3];
                auVar42 = vpmaxsd_avx(auVar41,auVar21);
                auVar43 = vpminsd_avx(auVar43,(undefined1  [16])tray.tfar.field_0);
              }
              uVar28 = vcmpps_avx512vl(auVar42,auVar43,2);
              if ((uVar28 & 0xf) == 0) {
                auVar63 = ZEXT1664(auVar45);
                sVar31 = sVar32;
              }
              else {
                auVar42 = vblendmps_avx512vl(auVar101._0_16_,auVar41);
                bVar24 = (bool)((byte)uVar28 & 1);
                bVar3 = (bool)((byte)(uVar28 >> 1) & 1);
                bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                bVar5 = (bool)((byte)(uVar28 >> 3) & 1);
                auVar63 = ZEXT1664(CONCAT412((uint)bVar5 * auVar42._12_4_ |
                                             (uint)!bVar5 * auVar41._12_4_,
                                             CONCAT48((uint)bVar4 * auVar42._8_4_ |
                                                      (uint)!bVar4 * auVar41._8_4_,
                                                      CONCAT44((uint)bVar3 * auVar42._4_4_ |
                                                               (uint)!bVar3 * auVar41._4_4_,
                                                               (uint)bVar24 * auVar42._0_4_ |
                                                               (uint)!bVar24 * auVar41._0_4_))));
                if (sVar32 != 8) {
                  pNVar35->ptr = sVar32;
                  pNVar35 = pNVar35 + 1;
                  *(undefined1 (*) [16])paVar30->v = auVar45;
                  paVar30 = paVar30 + 1;
                }
              }
              lVar29 = lVar29 + 1;
              auVar45 = auVar63._0_16_;
              sVar32 = sVar31;
            } while (lVar29 != 0x20);
            if (sVar31 == 8) goto LAB_006ac792;
            uVar9 = vcmpps_avx512vl((undefined1  [16])auVar63._0_16_,
                                    (undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar31;
          } while ((byte)uVar34 < (byte)POPCOUNT((int)uVar9));
          pNVar35->ptr = sVar31;
          pNVar35 = pNVar35 + 1;
          *paVar30 = auVar63._0_16_;
          paVar30 = paVar30 + 1;
        }
        else {
          do {
            sVar32 = 0;
            for (uVar28 = uVar37; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              sVar32 = sVar32 + 1;
            }
            bVar24 = occluded1(This,bvh,root,sVar32,&pre,ray,&tray,context);
            bVar26 = (byte)(1 << ((uint)sVar32 & 0x1f));
            if (!bVar24) {
              bVar26 = 0;
            }
            bVar33 = bVar33 | bVar26;
            uVar37 = uVar37 - 1 & uVar37;
          } while (uVar37 != 0);
          iVar25 = 3;
          if (bVar33 != 0xf) {
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar24 = (bool)(bVar33 >> 1 & 1);
            bVar3 = (bool)(bVar33 >> 2 & 1);
            bVar4 = (bool)(bVar33 >> 3 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar24 * auVar45._4_4_ | (uint)!bVar24 * tray.tfar.field_0.i[1];
            tray.tfar.field_0.i[0] =
                 (uint)(bVar33 & 1) * auVar45._0_4_ |
                 (uint)!(bool)(bVar33 & 1) * tray.tfar.field_0.i[0];
            tray.tfar.field_0.i[2] =
                 (uint)bVar3 * auVar45._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
            tray.tfar.field_0.i[3] =
                 (uint)bVar4 * auVar45._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
            iVar25 = 2;
          }
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar98 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar99 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar100 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar101 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar102 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar103 = ZEXT1664(auVar45);
          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar104 = ZEXT1664(auVar45);
          auVar63 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if (uVar34 < (uint)POPCOUNT(uVar27)) goto LAB_006ac42d;
        }
LAB_006ac792:
      } while (iVar25 != 3);
LAB_006ac9ef:
      bVar33 = bVar33 & bVar36;
      bVar24 = (bool)(bVar33 >> 1 & 1);
      bVar3 = (bool)(bVar33 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar33 & 1) * -0x800000 | (uint)!(bool)(bVar33 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar24 * -0x800000 | (uint)!bVar24 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar33 >> 3) * -0x800000 | (uint)!(bool)(bVar33 >> 3) * *(int *)(ray + 0x8c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }